

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturing.hpp
# Opt level: O3

Vector3<double> *
eos::render::detail::tex2d_linear<double>
          (Vector3<double> *__return_storage_ptr__,Vector2<double> *imageTexCoord,uchar mipmap_index
          ,Texture *texture)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uchar uVar10;
  pointer pIVar11;
  undefined2 uVar12;
  undefined1 auVar13 [16];
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  uint uVar17;
  double dVar18;
  long lVar19;
  double dVar20;
  undefined1 auVar21 [14];
  unkint10 Var22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [12];
  Pixel<unsigned_char,_4> *pPVar32;
  uint uVar33;
  uint uVar34;
  undefined7 in_register_00000011;
  int iVar35;
  int y;
  int iVar36;
  undefined1 extraout_XMM0_Ba;
  undefined1 uVar37;
  undefined1 extraout_XMM0_Bb;
  undefined1 uVar38;
  undefined1 extraout_XMM0_Bc;
  undefined1 uVar39;
  undefined1 extraout_XMM0_Bd;
  undefined1 uVar40;
  undefined1 extraout_XMM0_Be;
  undefined1 uVar41;
  undefined1 extraout_XMM0_Bf;
  undefined1 uVar42;
  undefined1 extraout_XMM0_Bg;
  undefined1 uVar43;
  undefined1 extraout_XMM0_Bh;
  undefined1 uVar44;
  undefined2 uVar98;
  undefined2 uVar99;
  int x;
  int iVar69;
  undefined1 auVar54 [16];
  undefined1 auVar66 [16];
  undefined2 uVar100;
  undefined2 uVar101;
  float fVar70;
  undefined1 auVar80 [16];
  undefined1 auVar91 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar55 [16];
  undefined1 auVar67 [16];
  undefined1 auVar56 [16];
  undefined1 auVar68 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar53 [16];
  undefined1 auVar65 [16];
  undefined1 auVar45 [16];
  undefined1 auVar57 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar81 [16];
  undefined1 auVar92 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar82 [16];
  undefined1 auVar93 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar79 [16];
  undefined1 auVar90 [16];
  undefined1 auVar71 [16];
  undefined1 auVar83 [16];
  
  dVar18 = (imageTexCoord->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array[0];
  dVar20 = (imageTexCoord->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array[1];
  x = (int)dVar18;
  iVar69 = (int)dVar20;
  fVar96 = (float)(dVar18 - (double)x);
  fVar97 = (float)(dVar20 - (double)iVar69);
  fVar95 = (1.0 - fVar96) * (1.0 - fVar97);
  fVar94 = (1.0 - fVar97) * fVar96;
  pIVar11 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar19 = (ulong)(uint)((int)CONCAT71(in_register_00000011,mipmap_index) << 3) * 5;
  fVar70 = (1.0 - fVar96) * fVar97;
  iVar36 = x;
  if (*(int *)((long)&pIVar11->width_ + lVar19) == x) {
    iVar36 = 0;
  }
  iVar35 = iVar69;
  if (*(int *)((long)&pIVar11->height_ + lVar19) == iVar69) {
    iVar35 = 0;
  }
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar11->height_ + lVar19),iVar35,iVar36);
  bVar1 = (pPVar32->data_)._M_elems[0];
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),iVar35
                       ,iVar36);
  bVar2 = (pPVar32->data_)._M_elems[1];
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),iVar35
                       ,iVar36);
  bVar3 = (pPVar32->data_)._M_elems[2];
  iVar36 = x + 1;
  pIVar11 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar35 = iVar36;
  if (iVar36 == *(int *)((long)&pIVar11->width_ + lVar19)) {
    iVar35 = 0;
  }
  y = iVar69;
  if (*(int *)((long)&pIVar11->height_ + lVar19) == iVar69) {
    y = 0;
  }
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar11->height_ + lVar19),y,iVar35);
  bVar4 = (pPVar32->data_)._M_elems[0];
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),y,
                       iVar35);
  bVar5 = (pPVar32->data_)._M_elems[1];
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),y,
                       iVar35);
  bVar6 = (pPVar32->data_)._M_elems[2];
  pIVar11 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (*(int *)((long)&pIVar11->width_ + lVar19) == x) {
    x = 0;
  }
  iVar69 = iVar69 + 1;
  iVar35 = iVar69;
  if (iVar69 == *(int *)((long)&pIVar11->height_ + lVar19)) {
    iVar35 = 0;
  }
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar11->height_ + lVar19),iVar35,x);
  bVar7 = (pPVar32->data_)._M_elems[0];
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),iVar35
                       ,x);
  bVar8 = (pPVar32->data_)._M_elems[1];
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),iVar35
                       ,x);
  bVar9 = (pPVar32->data_)._M_elems[2];
  pIVar11 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (iVar36 == *(int *)((long)&pIVar11->width_ + lVar19)) {
    iVar36 = 0;
  }
  if (iVar69 == *(int *)((long)&pIVar11->height_ + lVar19)) {
    iVar69 = 0;
  }
  fVar97 = fVar97 * fVar96;
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar11->height_ + lVar19),iVar69,iVar36);
  uVar10 = (pPVar32->data_)._M_elems[0];
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),iVar69
                       ,iVar36);
  uVar33 = (uint)bVar2 * 0x100 + (uint)bVar1;
  uVar34 = CONCAT13(extraout_XMM0_Bd,
                    CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
           CONCAT13(extraout_XMM0_Bd,
                    CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba)));
  uVar37 = (undefined1)uVar34;
  uVar38 = (undefined1)(uVar34 >> 8);
  uVar39 = (undefined1)(uVar34 >> 0x10);
  uVar40 = (undefined1)(uVar34 >> 0x18);
  uVar17 = CONCAT13(extraout_XMM0_Bh,
                    CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be))) ^
           CONCAT13(extraout_XMM0_Bh,
                    CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be)));
  uVar41 = (undefined1)uVar17;
  uVar42 = (undefined1)(uVar17 >> 8);
  uVar43 = (undefined1)(uVar17 >> 0x10);
  uVar44 = (undefined1)(uVar17 >> 0x18);
  auVar53._0_15_ = ZEXT415(uVar33);
  auVar53[0xf] = uVar44;
  auVar52._14_2_ = auVar53._14_2_;
  auVar52._0_13_ = ZEXT413(uVar33);
  auVar52[0xd] = uVar43;
  auVar51._13_3_ = auVar52._13_3_;
  auVar51._0_13_ = ZEXT413(uVar33);
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._4_7_ = 0;
  auVar50._0_4_ = uVar33;
  auVar50[0xb] = uVar42;
  auVar49._11_5_ = auVar50._11_5_;
  auVar49._4_7_ = 0;
  auVar49._0_4_ = uVar33;
  auVar48._10_6_ = auVar49._10_6_;
  auVar48._4_5_ = 0;
  auVar48._0_4_ = uVar33;
  auVar48[9] = uVar41;
  auVar47._9_7_ = auVar48._9_7_;
  auVar47._4_5_ = 0;
  auVar47._0_4_ = uVar33;
  Var22 = (unkuint10)CONCAT81(auVar47._8_8_,uVar40) << 8;
  auVar46._6_10_ = Var22;
  auVar46[5] = uVar39;
  auVar46[4] = (char)(uVar33 >> 0x10);
  auVar46._0_4_ = uVar33;
  auVar21._2_12_ = auVar46._4_12_;
  auVar21[1] = uVar38;
  auVar21[0] = (char)(uVar33 >> 8);
  uVar98 = CONCAT11(uVar37,(char)uVar33);
  auVar45._2_14_ = auVar21;
  uVar16 = (undefined2)(uVar17 >> 0x10);
  auVar56._0_12_ = auVar45._0_12_;
  auVar56._12_2_ = (short)Var22;
  auVar56._14_2_ = uVar16;
  uVar15 = (undefined2)uVar17;
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._0_10_ = auVar45._0_10_;
  auVar55._10_2_ = uVar15;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._0_8_ = auVar45._0_8_;
  auVar54._8_2_ = auVar46._4_2_;
  uVar14 = (undefined2)(uVar34 >> 0x10);
  auVar23._4_8_ = auVar54._8_8_;
  auVar23._2_2_ = uVar14;
  auVar23._0_2_ = auVar21._0_2_;
  uVar12 = (undefined2)uVar34;
  uVar34 = (uint)bVar5 * 0x100 + (uint)bVar4;
  auVar79._0_15_ = ZEXT415(uVar34);
  auVar79[0xf] = uVar44;
  auVar78._14_2_ = auVar79._14_2_;
  auVar78._0_13_ = ZEXT413(uVar34);
  auVar78[0xd] = uVar43;
  auVar77._13_3_ = auVar78._13_3_;
  auVar77._0_13_ = ZEXT413(uVar34);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._4_7_ = 0;
  auVar76._0_4_ = uVar34;
  auVar76[0xb] = uVar42;
  auVar75._11_5_ = auVar76._11_5_;
  auVar75._4_7_ = 0;
  auVar75._0_4_ = uVar34;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._4_5_ = 0;
  auVar74._0_4_ = uVar34;
  auVar74[9] = uVar41;
  auVar73._9_7_ = auVar74._9_7_;
  auVar73._4_5_ = 0;
  auVar73._0_4_ = uVar34;
  Var22 = (unkuint10)CONCAT81(auVar73._8_8_,uVar40) << 8;
  auVar72._6_10_ = Var22;
  auVar72[5] = uVar39;
  auVar72[4] = (char)(uVar34 >> 0x10);
  auVar72._0_4_ = uVar34;
  auVar24._2_12_ = auVar72._4_12_;
  auVar24[1] = uVar38;
  auVar24[0] = (char)(uVar34 >> 8);
  uVar100 = CONCAT11(uVar37,(char)uVar34);
  auVar71._2_14_ = auVar24;
  auVar82._0_12_ = auVar71._0_12_;
  auVar82._12_2_ = (short)Var22;
  auVar82._14_2_ = uVar16;
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._0_10_ = auVar71._0_10_;
  auVar81._10_2_ = uVar15;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._0_8_ = auVar71._0_8_;
  auVar80._8_2_ = auVar72._4_2_;
  auVar25._4_8_ = auVar80._8_8_;
  auVar25._2_2_ = uVar14;
  auVar25._0_2_ = auVar24._0_2_;
  uVar34 = (uint)bVar8 * 0x100 + (uint)bVar7;
  auVar65._0_15_ = ZEXT415(uVar34);
  auVar65[0xf] = uVar44;
  auVar64._14_2_ = auVar65._14_2_;
  auVar64._0_13_ = ZEXT413(uVar34);
  auVar64[0xd] = uVar43;
  auVar63._13_3_ = auVar64._13_3_;
  auVar63._0_13_ = ZEXT413(uVar34);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._4_7_ = 0;
  auVar62._0_4_ = uVar34;
  auVar62[0xb] = uVar42;
  auVar61._11_5_ = auVar62._11_5_;
  auVar61._4_7_ = 0;
  auVar61._0_4_ = uVar34;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._4_5_ = 0;
  auVar60._0_4_ = uVar34;
  auVar60[9] = uVar41;
  auVar59._9_7_ = auVar60._9_7_;
  auVar59._4_5_ = 0;
  auVar59._0_4_ = uVar34;
  Var22 = (unkuint10)CONCAT81(auVar59._8_8_,uVar40) << 8;
  auVar58._6_10_ = Var22;
  auVar58[5] = uVar39;
  auVar58[4] = (char)(uVar34 >> 0x10);
  auVar58._0_4_ = uVar34;
  auVar26._2_12_ = auVar58._4_12_;
  auVar26[1] = uVar38;
  auVar26[0] = (char)(uVar34 >> 8);
  uVar99 = CONCAT11(uVar37,(char)uVar34);
  auVar57._2_14_ = auVar26;
  auVar68._0_12_ = auVar57._0_12_;
  auVar68._12_2_ = (short)Var22;
  auVar68._14_2_ = uVar16;
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._0_10_ = auVar57._0_10_;
  auVar67._10_2_ = uVar15;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._0_8_ = auVar57._0_8_;
  auVar66._8_2_ = auVar58._4_2_;
  auVar27._4_8_ = auVar66._8_8_;
  auVar27._2_2_ = uVar14;
  auVar27._0_2_ = auVar26._0_2_;
  auVar90._0_15_ = ZEXT415(0);
  auVar90[0xf] = uVar44;
  auVar89._14_2_ = auVar90._14_2_;
  auVar89._0_13_ = ZEXT413(0);
  auVar89[0xd] = uVar43;
  auVar88._13_3_ = auVar89._13_3_;
  auVar88._0_13_ = ZEXT413(0);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._0_11_ = ZEXT411(0);
  auVar87[0xb] = uVar42;
  auVar86._11_5_ = auVar87._11_5_;
  auVar86._0_11_ = ZEXT411(0);
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._0_9_ = (unkuint9)0;
  auVar85[9] = uVar41;
  auVar84._9_7_ = auVar85._9_7_;
  auVar84._0_9_ = (unkuint9)0;
  auVar30._1_8_ = auVar84._8_8_;
  auVar30[0] = uVar40;
  auVar30._9_7_ = 0;
  auVar29._1_10_ = SUB1610(auVar30 << 0x38,6);
  auVar29[0] = uVar39;
  auVar29._11_5_ = 0;
  auVar28._2_12_ = SUB1612(auVar29 << 0x28,4);
  auVar28[1] = uVar38;
  auVar28[0] = (pPVar32->data_)._M_elems[1];
  uVar101 = CONCAT11(uVar37,uVar10);
  auVar83._2_14_ = auVar28;
  auVar93._0_12_ = auVar83._0_12_;
  auVar93._12_2_ = SUB162(auVar30 << 0x38,6);
  auVar93._14_2_ = uVar16;
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._0_10_ = auVar83._0_10_;
  auVar92._10_2_ = uVar15;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._0_8_ = auVar83._0_8_;
  auVar91._8_2_ = SUB162(auVar29 << 0x28,4);
  auVar31._4_8_ = auVar91._8_8_;
  auVar31._2_2_ = uVar14;
  auVar31._0_2_ = auVar28._0_2_;
  dVar18 = (double)(fVar97 * (float)auVar31._0_4_) +
           (double)(fVar70 * (float)auVar27._0_4_) +
           (double)(fVar94 * (float)auVar25._0_4_) + (double)(fVar95 * (float)auVar23._0_4_);
  auVar13._8_4_ = SUB84(dVar18,0);
  auVar13._0_8_ =
       (double)(fVar97 * (float)CONCAT22(uVar12,uVar101)) +
       (double)(fVar70 * (float)CONCAT22(uVar12,uVar99)) +
       (double)(fVar94 * (float)CONCAT22(uVar12,uVar100)) +
       (double)(fVar95 * (float)CONCAT22(uVar12,uVar98));
  auVar13._12_4_ = (int)((ulong)dVar18 >> 0x20);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar13;
  pPVar32 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar19),iVar69
                       ,iVar36);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] =
       (double)((float)(pPVar32->data_)._M_elems[2] * fVar97) +
       (double)((float)bVar9 * fVar70) +
       (double)((float)bVar6 * fVar94) + (double)((float)bVar3 * fVar95);
  return __return_storage_ptr__;
}

Assistant:

inline Eigen::Vector3<T> tex2d_linear(const Eigen::Vector2<T>& imageTexCoord, unsigned char mipmap_index,
                                      const Texture& texture)
{
    const int x = (int)imageTexCoord[0];
    const int y = (int)imageTexCoord[1];
    const float alpha = imageTexCoord[0] - x;
    const float beta = imageTexCoord[1] - y;
    const float oneMinusAlpha = 1.0f - alpha;
    const float oneMinusBeta = 1.0f - beta;
    const float a = oneMinusAlpha * oneMinusBeta;
    const float b = alpha * oneMinusBeta;
    const float c = oneMinusAlpha * beta;
    const float d = alpha * beta;
    Eigen::Vector3<T> color;

    // int pixelIndex;
    // pixelIndex = getPixelIndex_wrap(x, y, texture->mipmaps[mipmapIndex].cols,
    // texture->mipmaps[mipmapIndex].rows);
    int pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    int pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    // std::cout << texture.mipmaps[mipmapIndex].cols << " " << texture.mipmaps[mipmapIndex].rows << " " <<
    // texture.mipmaps[mipmapIndex].channels() << std::endl;  cv::imwrite("mm.png",
    // texture.mipmaps[mipmapIndex]);
    color[0] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    return color;
}